

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-disk-unix.c++
# Opt level: O3

void kj::anon_unknown_9::rmrfChildrenAndClose(int fd)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  DIR *__dirp;
  int *piVar5;
  dirent64 *pdVar6;
  size_t sVar7;
  ulong in_RCX;
  char *__s;
  StringPtr path;
  Fault f;
  Fault f_5;
  Fault local_40;
  Fault local_38;
  undefined8 uStack_30;
  
  __dirp = fdopendir(fd);
  if (__dirp == (DIR *)0x0) {
    close(fd);
    __errno_location();
    local_40.exception = (Exception *)0x0;
    local_38.exception = (Exception *)0x0;
    uStack_30 = 0;
    kj::_::Debug::Fault::init
              (&local_40,
               (EVP_PKEY_CTX *)
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
              );
    kj::_::Debug::Fault::fatal(&local_40);
  }
  piVar5 = __errno_location();
LAB_004d1361:
  *piVar5 = 0;
  pdVar6 = readdir64(__dirp);
  if (pdVar6 == (dirent64 *)0x0) {
    if (*piVar5 == 0) {
      closedir(__dirp);
      return;
    }
    local_40.exception = (Exception *)0x0;
    local_38.exception = (Exception *)0x0;
    uStack_30 = 0;
    kj::_::Debug::Fault::init
              (&local_40,
               (EVP_PKEY_CTX *)
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
              );
    kj::_::Debug::Fault::fatal(&local_40);
  }
  if (pdVar6->d_name[0] == '.') {
    bVar1 = pdVar6->d_name[1];
    in_RCX = (ulong)bVar1;
    if ((bVar1 == 0) || ((bVar1 == 0x2e && (pdVar6->d_name[2] == '\0')))) goto LAB_004d1361;
  }
  __s = pdVar6->d_name;
  if (pdVar6->d_type == '\0') {
    sVar7 = strlen(__s);
    path.content.size_ = in_RCX;
    path.content.ptr = (char *)(sVar7 + 1);
    bVar2 = rmrf((anon_unknown_9 *)(ulong)(uint)fd,(int)__s,path);
    local_40.exception._0_1_ = bVar2;
    if (!bVar2) {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&>
                (&local_38,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                 ,0xc6,FAILED,"rmrf(fd, entry->d_name)","_kjCondition,",
                 (DebugExpression<bool> *)&local_40);
      kj::_::Debug::Fault::fatal(&local_38);
    }
  }
  else if (pdVar6->d_type == '\x04') {
    do {
      iVar3 = openat64(fd,__s,0xb0000);
      if (-1 < iVar3) goto LAB_004d13da;
      iVar4 = kj::_::Debug::getOsErrorNumber(false);
    } while (iVar4 == -1);
    if (iVar4 != 0) {
      local_40.exception = (Exception *)0x0;
      local_38.exception = (Exception *)0x0;
      uStack_30 = 0;
      kj::_::Debug::Fault::init
                (&local_40,
                 (EVP_PKEY_CTX *)
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                );
      kj::_::Debug::Fault::fatal(&local_40);
    }
LAB_004d13da:
    rmrfChildrenAndClose(iVar3);
    do {
      iVar3 = unlinkat(fd,__s,0x200);
      if (-1 < iVar3) goto LAB_004d1361;
      iVar3 = kj::_::Debug::getOsErrorNumber(false);
    } while (iVar3 == -1);
    if (iVar3 != 0) {
      local_40.exception = (Exception *)0x0;
      local_38.exception = (Exception *)0x0;
      uStack_30 = 0;
      kj::_::Debug::Fault::init
                (&local_40,
                 (EVP_PKEY_CTX *)
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                );
      kj::_::Debug::Fault::fatal(&local_40);
    }
  }
  else {
    do {
      iVar3 = unlinkat(fd,__s,0);
      if (-1 < iVar3) goto LAB_004d1361;
      iVar3 = kj::_::Debug::getOsErrorNumber(false);
    } while (iVar3 == -1);
    if (iVar3 != 0) {
      local_40.exception = (Exception *)0x0;
      local_38.exception = (Exception *)0x0;
      uStack_30 = 0;
      kj::_::Debug::Fault::init
                (&local_40,
                 (EVP_PKEY_CTX *)
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                );
      kj::_::Debug::Fault::fatal(&local_40);
    }
  }
  goto LAB_004d1361;
}

Assistant:

static void rmrfChildrenAndClose(int fd) {
  // Assumes fd is seeked to beginning.

  DIR* dir = fdopendir(fd);
  if (dir == nullptr) {
    close(fd);
    KJ_FAIL_SYSCALL("fdopendir", errno);
  };
  KJ_DEFER(closedir(dir));

  for (;;) {
    errno = 0;
    struct dirent* entry = readdir(dir);
    if (entry == nullptr) {
      int error = errno;
      if (error == 0) {
        break;
      } else {
        KJ_FAIL_SYSCALL("readdir", error);
      }
    }

    if (entry->d_name[0] == '.' &&
        (entry->d_name[1] == '\0' ||
         (entry->d_name[1] == '.' &&
          entry->d_name[2] == '\0'))) {
      // ignore . and ..
    } else {
#ifdef DT_UNKNOWN    // d_type is not available on all platforms.
      if (entry->d_type == DT_DIR) {
        int subdirFd;
        KJ_SYSCALL(subdirFd = openat(
            fd, entry->d_name, O_RDONLY | MAYBE_O_DIRECTORY | MAYBE_O_CLOEXEC | O_NOFOLLOW));
        rmrfChildrenAndClose(subdirFd);
        KJ_SYSCALL(unlinkat(fd, entry->d_name, AT_REMOVEDIR));
      } else if (entry->d_type != DT_UNKNOWN) {
        KJ_SYSCALL(unlinkat(fd, entry->d_name, 0));
      } else {
#endif
        KJ_ASSERT(rmrf(fd, entry->d_name));
#ifdef DT_UNKNOWN
      }
#endif
    }
  }
}